

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int itf8_encode(cram_fd *fd,int32_t val)

{
  hFILE *fp;
  byte bVar1;
  undefined1 uVar2;
  undefined8 in_RAX;
  ulong __n;
  undefined1 uVar3;
  undefined1 uVar4;
  ulong totalbytes;
  ulong uVar5;
  char buf [5];
  undefined8 uStack_28;
  
  uVar2 = (undefined1)val;
  uStack_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_28._0_3_ = (undefined3)in_RAX;
  if ((uint)val < 0x80) {
    uStack_28._0_4_ = CONCAT13(uVar2,(undefined3)uStack_28);
    totalbytes = 1;
  }
  else {
    bVar1 = (byte)((uint)val >> 0x18);
    uVar3 = (undefined1)((uint)val >> 8);
    uStack_28._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
    if ((uint)val < 0x4000) {
      uStack_28 = CONCAT35(uStack_28._5_3_,CONCAT14(uVar2,CONCAT13(uVar3,(undefined3)uStack_28))) |
                  0x80000000;
      totalbytes = 2;
    }
    else {
      uVar4 = (undefined1)((uint)val >> 0x10);
      uStack_28._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
      if ((uint)val < 0x200000) {
        uStack_28 = CONCAT26(uStack_28._6_2_,
                             CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,(undefined3)uStack_28))))
                    | 0xc0000000;
        totalbytes = 3;
      }
      else if ((uint)val < 0x10000000) {
        uStack_28._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
        uStack_28 = CONCAT17(uStack_28._7_1_,
                             CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(bVar1,(undefined3
                                                                                         )uStack_28)
                                                                   )))) | 0xe0000000;
        totalbytes = 4;
      }
      else {
        uStack_28 = CONCAT17(uVar2,CONCAT16((char)((uint)val >> 4),
                                            CONCAT15((char)((uint)val >> 0xc),
                                                     CONCAT14((char)((uint)val >> 0x14),
                                                              CONCAT13(bVar1 >> 4,
                                                                       (undefined3)uStack_28))))) &
                    0xfffffffffffffff | 0xf0000000;
        totalbytes = 5;
      }
    }
  }
  fp = fd->fp;
  uVar5 = (long)fp->limit - (long)fp->begin;
  __n = totalbytes;
  if (uVar5 < totalbytes) {
    __n = uVar5;
  }
  memcpy(fp->begin,(void *)((long)&uStack_28 + 3),__n);
  fp->begin = fp->begin + __n;
  if (uVar5 < totalbytes) {
    __n = hwrite2(fp,(void *)((long)&uStack_28 + 3),totalbytes,__n);
  }
  return -(uint)(__n != totalbytes);
}

Assistant:

int itf8_encode(cram_fd *fd, int32_t val) {
    char buf[5];
    int len = itf8_put(buf, val);
    return hwrite(fd->fp, buf, len) == len ? 0 : -1;
}